

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

void __thiscall
mp::BasicExprFactory<std::allocator<char>_>::AddFunctions
          (BasicExprFactory<std::allocator<char>_> *this,int num_funcs)

{
  undefined8 *puVar1;
  SafeInt<int> local_1c;
  
  SafeInt<int>::SafeInt<unsigned_long>
            (&local_1c,
             (long)(this->funcs_).
                   super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->funcs_).
                   super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (local_1c.value_ < 0) {
    if (num_funcs < -0x80000000 - local_1c.value_) goto LAB_0011e11a;
  }
  else if ((int)(local_1c.value_ ^ 0x7fffffffU) < num_funcs) {
LAB_0011e11a:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = &PTR__exception_00199830;
    __cxa_throw(puVar1,&OverflowError::typeinfo,std::exception::~exception);
  }
  std::vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>::resize
            (&this->funcs_,(long)(local_1c.value_ + num_funcs));
  return;
}

Assistant:

void AddFunctions(int num_funcs) {
    MP_ASSERT(num_funcs >= 0, "invalid size");
    funcs_.resize(val(SafeInt<int>(funcs_.size()) + num_funcs));
  }